

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeCreator.hpp
# Opt level: O0

void __thiscall OpenMD::LatticeCreator::~LatticeCreator(LatticeCreator *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__LatticeCreator_00507690;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~LatticeCreator() = default;